

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateSharedHandleNoDestroy
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
          *handleData)

{
  int iVar1;
  _Base_ptr p_Var2;
  long lVar3;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  allocator_type local_20b;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_20a;
  allocator<char> local_209;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
  *local_208;
  string *local_200;
  _Rb_tree_node_base *local_1f8;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string aliasHandle;
  string type;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150 [3];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  if ((handleData->second).deleteCommand._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_150,"Vk",(allocator<char> *)&aliasHandle);
    local_200 = __return_storage_ptr__;
    stripPrefix(&type,&handleData->first,&local_150[0].first);
    std::__cxx11::string::~string((string *)local_150);
    aliasHandle._M_dataplus._M_p = (pointer)&aliasHandle.field_2;
    aliasHandle._M_string_length = 0;
    aliasHandle.field_2._M_local_buf[0] = '\0';
    local_1f8 = &(handleData->second).aliases._M_t._M_impl.super__Rb_tree_header._M_header;
    local_208 = handleData;
    for (p_Var2 = (handleData->second).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var2 != local_1f8; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      if (generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
          ::aliasHandleTemplate_abi_cxx11_ == '\0') {
        iVar1 = __cxa_guard_acquire(&generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                                     ::aliasHandleTemplate_abi_cxx11_);
        if (iVar1 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     &generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                      ::aliasHandleTemplate_abi_cxx11_,
                     "  using Shared${aliasType} = SharedHandle<${type}>;",
                     (allocator<char> *)local_150);
          __cxa_atexit(std::__cxx11::string::~string,
                       &generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                        ::aliasHandleTemplate_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                               ::aliasHandleTemplate_abi_cxx11_);
        }
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"Vk",&local_209);
      stripPrefix(&local_1d0,(string *)(p_Var2 + 1),&local_1f0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (local_150,(char (*) [10])"aliasType",&local_1d0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (local_150 + 1,(char (*) [5])0x1bd42f,&type);
      __l._M_len = 2;
      __l._M_array = local_150;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_60,__l,&local_20a,&local_20b);
      replaceWithMap(&local_1b0,
                     &generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                      ::aliasHandleTemplate_abi_cxx11_,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_60);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&aliasHandle,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
      lVar3 = 0x40;
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&local_150[0].first._M_dataplus._M_p + lVar3));
        lVar3 = lVar3 + -0x40;
      } while (lVar3 != -0x40);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    if (generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
        ::sharedHandleTemplate_abi_cxx11_ == '\0') {
      iVar1 = __cxa_guard_acquire(&generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                                   ::sharedHandleTemplate_abi_cxx11_);
      if (iVar1 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   &generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                    ::sharedHandleTemplate_abi_cxx11_,
                   "\ntemplate <>\nclass SharedHandle<${type}> : public SharedHandleBaseNoDestroy<${type}, ${parent}>\n{\n  friend SharedHandleBase<${type}, ${parent}>;\n\npublic:\n  SharedHandle() = default;\n  explicit SharedHandle(${type} handle, ${parent} parent) noexcept\n    : SharedHandleBaseNoDestroy<${type}, ${parent}>(handle, std::move(parent))\n  {}\n};\nusing Shared${type} = SharedHandle<${type}>;\n${aliasHandle}"
                   ,(allocator<char> *)local_150);
        __cxa_atexit(std::__cxx11::string::~string,
                     &generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                      ::sharedHandleTemplate_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                             ::sharedHandleTemplate_abi_cxx11_);
      }
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_150,(char (*) [12])"aliasHandle",&aliasHandle);
    __return_storage_ptr__ = local_200;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"Vk",&local_209);
    stripPrefix(&local_1d0,&(local_208->second).parent,&local_1f0);
    std::operator+(&local_1b0,"Shared",&local_1d0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (local_150 + 1,(char (*) [7])"parent",&local_1b0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_150 + 2,(char (*) [5])0x1bd42f,&type);
    __l_00._M_len = 3;
    __l_00._M_array = local_150;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&local_90,__l_00,&local_20a,&local_20b);
    replaceWithMap(__return_storage_ptr__,
                   &generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                    ::sharedHandleTemplate_abi_cxx11_,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_90);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_90);
    lVar3 = 0x80;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&local_150[0].first._M_dataplus._M_p + lVar3));
      lVar3 = lVar3 + -0x40;
    } while (lVar3 != -0x40);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&aliasHandle);
    std::__cxx11::string::~string((string *)&type);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)local_150);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateSharedHandleNoDestroy( std::pair<std::string, HandleData> const & handleData ) const
{
  if ( handleData.second.deleteCommand.empty() )
  {
    std::string type = stripPrefix( handleData.first, "Vk" );
    std::string aliasHandle;
    for ( auto const & alias : handleData.second.aliases )
    {
      static const std::string aliasHandleTemplate = R"(  using Shared${aliasType} = SharedHandle<${type}>;)";

      aliasHandle += replaceWithMap( aliasHandleTemplate, { { "aliasType", stripPrefix( alias.first, "Vk" ) }, { "type", type } } );
    }

    static const std::string sharedHandleTemplate = R"(
template <>
class SharedHandle<${type}> : public SharedHandleBaseNoDestroy<${type}, ${parent}>
{
  friend SharedHandleBase<${type}, ${parent}>;

public:
  SharedHandle() = default;
  explicit SharedHandle(${type} handle, ${parent} parent) noexcept
    : SharedHandleBaseNoDestroy<${type}, ${parent}>(handle, std::move(parent))
  {}
};
using Shared${type} = SharedHandle<${type}>;
${aliasHandle})";

    return replaceWithMap( sharedHandleTemplate,
                           { { "aliasHandle", aliasHandle }, { "parent", "Shared" + stripPrefix( handleData.second.parent, "Vk" ) }, { "type", type } } );
  }
  return "";
}